

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void * new<Memory::NoThrowHeapAllocator>
                 (size_t byteSize,NoThrowHeapAllocator *alloc,bool nothrow,AllocFuncType AllocFunc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  long in_R8;
  
  if ((int)CONCAT71(in_register_00000011,nothrow) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x219,"(nothrow)","nothrow");
    if (!bVar2) goto LAB_00396e80;
    *puVar3 = 0;
  }
  if (byteSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x21a,"(byteSize != 0)","byteSize != 0");
    if (!bVar2) {
LAB_00396e80:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((AllocFunc & 1) != 0) {
    AllocFunc = *(undefined8 *)(*(long *)(alloc + in_R8) + -1 + AllocFunc);
  }
  pvVar4 = (void *)(*(code *)AllocFunc)(alloc + in_R8,byteSize);
  return pvVar4;
}

Assistant:

__cdecl
operator new(DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, bool nothrow, char * (TAllocator::*AllocFunc)(size_t))
{
    Assert(nothrow);
    Assert(byteSize != 0);
    void * buffer = (alloc->*AllocFunc)(byteSize);
    return buffer;
}